

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O2

Vector __thiscall Vector::ProjectVector(Vector *this,Vector *a)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector VVar7;
  
  fVar1 = a->m_vec[2];
  fVar2 = this->m_vec[2];
  fVar5 = (float)*(undefined8 *)a->m_vec;
  fVar6 = (float)((ulong)*(undefined8 *)a->m_vec >> 0x20);
  uVar3 = *(undefined8 *)this->m_vec;
  fVar4 = Dot(a,a);
  fVar4 = ((float)((ulong)uVar3 >> 0x20) * fVar6 + (float)uVar3 * fVar5 + fVar2 * fVar1) / fVar4;
  VVar7.m_vec[0] = fVar4 * fVar5;
  VVar7.m_vec[1] = fVar4 * fVar6;
  VVar7.m_vec[2] = fVar4 * fVar1;
  VVar7.m_length = -1.0;
  return VVar7;
}

Assistant:

Vector Vector::ProjectVector(Vector &a)
{
   Vector res, b;

   b.Set(X(), Y(), Z());
   res.Set(a.X(), a.Y(), a.Z());

   res.Scale(a.Dot(b) / a.Dot(a));

   return res;
}